

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void Am_Copy_Values_To_Command(Am_Object *from_object)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object command;
  Am_Value value;
  Am_Object AStack_28;
  Am_Value local_20;
  
  bVar1 = Am_Object::Valid(from_object);
  if (bVar1) {
    Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)from_object,0xc5);
    local_20.type = 0;
    local_20.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar2 = Am_Object::Get(from_object,0x169,1);
    Am_Value::operator=(&local_20,pAVar2);
    pAVar2 = &local_20;
    bVar1 = Am_Value::Exists(pAVar2);
    if (!bVar1) {
      pAVar2 = &Am_No_Value;
    }
    Am_Object::Set(&AStack_28,0x169,pAVar2,1);
    pAVar2 = Am_Object::Get(from_object,0x16d,1);
    Am_Value::operator=(&local_20,pAVar2);
    pAVar2 = &local_20;
    bVar1 = Am_Value::Exists(pAVar2);
    if (!bVar1) {
      pAVar2 = &Am_No_Value;
    }
    Am_Object::Set(&AStack_28,0x16d,pAVar2,1);
    pAVar2 = Am_Object::Get(from_object,0x16c,1);
    Am_Value::operator=(&local_20,pAVar2);
    pAVar2 = &local_20;
    bVar1 = Am_Value::Exists(pAVar2);
    if (!bVar1) {
      pAVar2 = &Am_No_Value;
    }
    Am_Object::Set(&AStack_28,0x16c,pAVar2,1);
    Am_Value::~Am_Value(&local_20);
    Am_Object::~Am_Object(&AStack_28);
  }
  return;
}

Assistant:

void
Am_Copy_Values_To_Command(Am_Object from_object)
{
  if (from_object.Valid()) {
    Am_Object command = from_object.Get_Object(Am_COMMAND);
    Am_Value value;
    value = from_object.Peek(Am_VALUE);
    command.Set(Am_VALUE, value.Exists() ? value : Am_No_Value,
                Am_OK_IF_NOT_THERE);
    value = from_object.Peek(Am_OBJECT_MODIFIED);
    command.Set(Am_OBJECT_MODIFIED, value.Exists() ? value : Am_No_Value,
                Am_OK_IF_NOT_THERE);
    value = from_object.Peek(Am_OLD_VALUE);
    command.Set(Am_OLD_VALUE, value.Exists() ? value : Am_No_Value,
                Am_OK_IF_NOT_THERE);
  }
}